

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Parameters *extraout_RDX;
  Unique<vk::Handle<(vk::HandleType)23>_> obj2;
  Unique<vk::Handle<(vk::HandleType)23>_> obj3;
  Unique<vk::Handle<(vk::HandleType)23>_> obj1;
  Environment env;
  Unique<vk::Handle<(vk::HandleType)23>_> obj0;
  VkImageView attachments_2 [2];
  VkImageView attachments_3 [2];
  Resources res;
  Move<vk::Handle<(vk::HandleType)23>_> local_258;
  Move<vk::Handle<(vk::HandleType)23>_> local_238;
  Move<vk::Handle<(vk::HandleType)23>_> local_218;
  VkFramebufferCreateInfo local_1f0;
  Environment local_1b0;
  VkFramebuffer local_178;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_170;
  Move<vk::Handle<(vk::HandleType)23>_> local_158;
  VkImageView local_138;
  DeviceInterface *local_130;
  Resources local_128;
  
  local_1b0.vkp = context->m_platformInterface;
  local_1b0.vkd = Context::getDeviceInterface(context);
  local_1b0.device = Context::getDevice(context);
  local_1b0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_1b0.programBinaries = context->m_progCollection;
  local_1b0.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_1b0.maxResourceConsumers = 4;
  Framebuffer::Resources::Resources(&local_128,&local_1b0,extraout_RDX);
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_128.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_128.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
       .object.m_internal;
  local_1f0.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_1f0.pNext = (void *)0x0;
  local_1f0.flags = 0;
  local_1f0.renderPass.m_internal =
       local_128.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_1f0.attachmentCount = 2;
  local_1f0.width = 0x100;
  local_1f0.height = 0x100;
  local_1f0.layers = 1;
  local_1f0.pAttachments = (VkImageView *)&local_258;
  ::vk::createFramebuffer
            (&local_218,local_1b0.vkd,local_1b0.device,&local_1f0,local_1b0.allocationCallbacks);
  local_178.m_internal =
       local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  DStack_170.m_deviceIface =
       local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  DStack_170.m_device =
       local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  DStack_170.m_allocator =
       local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_1f0.pAttachments = (VkImageView *)&local_238;
  local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_128.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_128.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
       .object.m_internal;
  local_1f0.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_1f0.pNext = (void *)0x0;
  local_1f0.flags = 0;
  local_1f0.renderPass.m_internal =
       local_128.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_1f0.attachmentCount = 2;
  local_1f0.width = 0x100;
  local_1f0.height = 0x100;
  local_1f0.layers = 1;
  ::vk::createFramebuffer
            (&local_258,local_1b0.vkd,local_1b0.device,&local_1f0,local_1b0.allocationCallbacks);
  local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_1f0.pAttachments = (VkImageView *)&local_158;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_128.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_128.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data
       .object.m_internal;
  local_1f0.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_1f0.pNext = (void *)0x0;
  local_1f0.flags = 0;
  local_1f0.renderPass.m_internal =
       local_128.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_1f0.attachmentCount = 2;
  local_1f0.width = 0x100;
  local_1f0.height = 0x100;
  local_1f0.layers = 1;
  ::vk::createFramebuffer
            (&local_238,local_1b0.vkd,local_1b0.device,&local_1f0,local_1b0.allocationCallbacks);
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_1f0.pAttachments = &local_138;
  local_138.m_internal =
       local_128.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_130 = (DeviceInterface *)
              local_128.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>
              .m_data.object.m_internal;
  local_1f0.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_1f0.pNext = (void *)0x0;
  local_1f0.flags = 0;
  local_1f0.renderPass.m_internal =
       local_128.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_1f0.attachmentCount = 2;
  local_1f0.width = 0x100;
  local_1f0.height = 0x100;
  local_1f0.layers = 1;
  ::vk::createFramebuffer
            (&local_158,local_1b0.vkd,local_1b0.device,&local_1f0,local_1b0.allocationCallbacks);
  local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  if (local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_238.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_158.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_258.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_218.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_178.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_170,local_178);
  }
  local_1f0._0_8_ = (void *)((long)&local_1f0 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1f0._0_8_,
             (long)local_1f0.pNext + local_1f0._0_8_);
  if ((void *)local_1f0._0_8_ != (void *)((long)&local_1f0 + 0x10U)) {
    operator_delete((void *)local_1f0._0_8_,CONCAT44(local_1f0._20_4_,local_1f0.flags) + 1);
  }
  Framebuffer::Resources::~Resources(&local_128);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}